

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O2

bool Fossilize::StreamArchive::find_entry_from_metadata
               (ExportedMetadataHeader *header,ResourceTag tag,Hash hash,Entry *entry)

{
  uint64_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  ExportedMetadataBlock *pEVar5;
  long lVar6;
  ExportedMetadataBlock *pEVar7;
  Hash local_18;
  
  uVar1 = header->lists[tag].count;
  if (((uVar1 != 0) &&
      (lVar6 = (long)&((ExportedMetadataHeader *)(header->lists + -1))->magic +
               header->lists[tag].offset, pEVar7 = (ExportedMetadataBlock *)(uVar1 * 0x20 + lVar6),
      local_18 = hash,
      pEVar5 = std::
               __lower_bound<Fossilize::ExportedMetadataBlock_const*,unsigned_long,__gnu_cxx::__ops::_Iter_comp_val<Fossilize::StreamArchive::find_entry_from_metadata(Fossilize::ExportedMetadataHeader_const*,Fossilize::ResourceTag,unsigned_long,Fossilize::StreamArchive::Entry*)::_lambda(Fossilize::ExportedMetadataBlock_const&,unsigned_long)_1_>>
                         (lVar6,pEVar7,&local_18), pEVar5 != pEVar7)) && (pEVar5->hash == local_18))
  {
    if (entry == (Entry *)0x0) {
      return true;
    }
    entry->offset = pEVar5->file_offset;
    uVar2 = (pEVar5->payload).format;
    uVar3 = (pEVar5->payload).crc;
    uVar4 = (pEVar5->payload).uncompressed_size;
    (entry->header).payload_size = (pEVar5->payload).payload_size;
    (entry->header).format = uVar2;
    (entry->header).crc = uVar3;
    (entry->header).uncompressed_size = uVar4;
    return true;
  }
  return false;
}

Assistant:

static bool find_entry_from_metadata(const ExportedMetadataHeader *header, ResourceTag tag, Hash hash, Entry *entry)
	{
		size_t count = header->lists[tag].count;
		if (!count)
			return false;

		// Binary search in-place.
		auto *blocks = reinterpret_cast<const ExportedMetadataBlock *>(
				reinterpret_cast<const uint8_t *>(header) + header->lists[tag].offset);

		auto itr = std::lower_bound(blocks, blocks + count, hash, [](const ExportedMetadataBlock &a, Hash hash_) {
			return a.hash < hash_;
		});

		if (itr != blocks + count && itr->hash == hash)
		{
			if (entry)
			{
				entry->offset = itr->file_offset;
				entry->header = itr->payload;
			}
			return true;
		}
		else
			return false;
	}